

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tinyxml.cpp
# Opt level: O3

void __thiscall
despot::util::tinyxml::TiXmlAttribute::SetDoubleValue(TiXmlAttribute *this,double _value)

{
  size_t len;
  char buf [256];
  char acStack_118 [264];
  
  snprintf(acStack_118,0x100,"%lf");
  len = strlen(acStack_118);
  TiXmlString::assign(&this->value,acStack_118,len);
  return;
}

Assistant:

void TiXmlAttribute::SetDoubleValue(double _value) {
	char buf[256];
#if defined(TIXML_SNPRINTF)
	TIXML_SNPRINTF(buf, sizeof(buf), "%lf", _value);
#else
	sprintf (buf, "%lf", _value);
#endif
	SetValue(buf);
}